

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O3

DOMNodeList * __thiscall
xercesc_4_0::DOMDocumentImpl::getDeepNodeList
          (DOMDocumentImpl *this,DOMNode *rootNode,XMLCh *namespaceURI,XMLCh *localName)

{
  int iVar1;
  undefined4 extraout_var;
  DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> *pDVar3;
  undefined4 extraout_var_00;
  XMLSize_t elemId;
  DOMDeepNodeListImpl *pDVar4;
  XMLSize_t hashVal;
  XMLSize_t XStack_38;
  DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *pDVar2;
  
  pDVar2 = this->fNodeListPool;
  if (pDVar2 == (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)0x0
     ) {
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x40);
    pDVar2 = (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)
             CONCAT44(extraout_var,iVar1);
    DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
    DOMDeepNodeListPool(pDVar2,0x6d,false,0x80);
    this->fNodeListPool = pDVar2;
  }
  pDVar3 = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
           findBucketElem(pDVar2,rootNode,localName,namespaceURI,&XStack_38);
  if ((pDVar3 == (DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> *)0x0) ||
     (pDVar4 = pDVar3->fData, pDVar4 == (DOMDeepNodeListImpl *)0x0)) {
    pDVar2 = this->fNodeListPool;
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x40);
    DOMDeepNodeListImpl::DOMDeepNodeListImpl
              ((DOMDeepNodeListImpl *)CONCAT44(extraout_var_00,iVar1),rootNode,namespaceURI,
               localName);
    elemId = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::put
                       (pDVar2,rootNode,localName,namespaceURI,
                        (DOMDeepNodeListImpl *)CONCAT44(extraout_var_00,iVar1));
    pDVar4 = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::getById
                       (this->fNodeListPool,elemId);
  }
  return &pDVar4->super_DOMNodeList;
}

Assistant:

DOMNodeList *DOMDocumentImpl::getDeepNodeList(const DOMNode *rootNode,     //DOM Level 2
                                                   const XMLCh *namespaceURI,
                                                   const XMLCh *localName)
{
    if(!fNodeListPool) {
        fNodeListPool = new (this) DOMDeepNodeListPool<DOMDeepNodeListImpl>(109, false);
    }

    DOMDeepNodeListImpl* retList = fNodeListPool->getByKey(rootNode, localName, namespaceURI);
    if (!retList) {
        // the pool will adopt the DOMDeepNodeListImpl
        XMLSize_t id = fNodeListPool->put((void*) rootNode, (XMLCh*) localName, (XMLCh*) namespaceURI, new (this) DOMDeepNodeListImpl(rootNode, namespaceURI, localName));
        retList = fNodeListPool->getById(id);
    }

    return retList;
}